

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

TestCaseGroup *
vkt::pipeline::anon_unknown_0::createBuiltInOverrideTests
          (TestContext *testCtx,VkShaderStageFlagBits shaderStage)

{
  TestCaseGroup *pTVar1;
  GenericValue value_;
  TestNode *this;
  SpecConstantTest *this_00;
  CaseDefinition *local_3f0;
  int local_2ec;
  int defNdx;
  OffsetValue local_2d8;
  allocator<char> local_2c3;
  allocator<char> local_2c2;
  allocator<char> local_2c1;
  deUint64 local_2c0;
  allocator<char> local_2b1;
  string local_2b0;
  SpecConstant local_290;
  allocator<char> local_255;
  undefined1 local_254;
  undefined1 local_253;
  undefined1 local_252;
  undefined1 local_251;
  deUint64 local_250;
  OffsetValue local_248;
  allocator<char> local_234;
  allocator<char> local_233;
  allocator<char> local_232;
  allocator<char> local_231;
  string local_230;
  SpecConstant local_210;
  allocator<char> local_1d1;
  string *local_1d0;
  undefined1 local_1c8 [8];
  CaseDefinition defs [2];
  DefaultDeleter<tcu::TestCaseGroup> local_3d [13];
  undefined1 local_30 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  VkShaderStageFlagBits shaderStage_local;
  TestContext *testCtx_local;
  
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _12_4_ = shaderStage;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"builtin","built-in override");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_3d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_30,pTVar1
            );
  local_1d0 = (string *)local_1c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"default",&local_1d1);
  local_254 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"layout(constant_id = ${ID}) gl_MaxImageUnits;",&local_231);
  SpecConstant::SpecConstant(&local_210,1,&local_230);
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
              *)((long)&defs[0].name.field_2 + 8),&local_210);
  local_253 = 1;
  defs[0].specConstants.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[0].ssboSize,"    bool ok;\n",&local_232);
  local_252 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[0].ssboCode.field_2._M_local_buf + 8),"",&local_233);
  local_251 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[0].globalCode.field_2._M_local_buf + 8),
             "    sb_out.ok = (gl_MaxImageUnits >= 8);\n",&local_234);
  local_250 = (deUint64)makeValueBool32(true);
  OffsetValue::OffsetValue(&local_248,4,0,(GenericValue)local_250);
  makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
            ((vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
              *)((long)&defs[0].mainCode.field_2 + 8),&local_248);
  defs[0].expectedValues.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_251 = 0;
  local_252 = 0;
  local_253 = 0;
  local_254 = 0;
  local_1d0 = (string *)&defs[0].requirements;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[0].requirements,"specialized",&local_255);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"layout(constant_id = ${ID}) gl_MaxImageUnits;",&local_2b1);
  local_2c0 = (deUint64)makeValueInt32(0xc);
  SpecConstant::SpecConstant(&local_290,1,&local_2b0,4,(GenericValue)local_2c0);
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
              *)((long)&defs[1].name.field_2 + 8),&local_290);
  defs[1].specConstants.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[1].ssboSize,"    int maxImageUnits;\n",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[1].ssboCode.field_2._M_local_buf + 8),"",&local_2c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[1].globalCode.field_2._M_local_buf + 8),
             "    sb_out.maxImageUnits = gl_MaxImageUnits;\n",&local_2c3);
  value_ = makeValueInt32(0xc);
  OffsetValue::OffsetValue(&local_2d8,4,0,value_);
  makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
            ((vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
              *)((long)&defs[1].mainCode.field_2 + 8),&local_2d8);
  defs[1].expectedValues.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::allocator<char>::~allocator(&local_2c3);
  std::allocator<char>::~allocator(&local_2c2);
  std::allocator<char>::~allocator(&local_2c1);
  SpecConstant::~SpecConstant(&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::allocator<char>::~allocator(&local_255);
  std::allocator<char>::~allocator(&local_234);
  std::allocator<char>::~allocator(&local_233);
  std::allocator<char>::~allocator(&local_232);
  SpecConstant::~SpecConstant(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::~allocator(&local_1d1);
  for (local_2ec = 0; local_2ec < 2; local_2ec = local_2ec + 1) {
    this = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_30)->super_TestNode;
    this_00 = (SpecConstantTest *)operator_new(0x138);
    SpecConstantTest::SpecConstantTest
              (this_00,testCtx,
               testGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               _12_4_,(CaseDefinition *)&defs[(long)local_2ec + -1].requirements);
    tcu::TestNode::addChild(this,(TestNode *)this_00);
  }
  pTVar1 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_30)
  ;
  local_3f0 = (CaseDefinition *)&defs[1].requirements;
  do {
    local_3f0 = local_3f0 + -1;
    CaseDefinition::~CaseDefinition(local_3f0);
  } while (local_3f0 != (CaseDefinition *)local_1c8);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_30);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createBuiltInOverrideTests (tcu::TestContext& testCtx, const VkShaderStageFlagBits shaderStage)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup (new tcu::TestCaseGroup(testCtx, "builtin", "built-in override"));

	const CaseDefinition defs[] =
	{
		{
			"default",
			makeVector(SpecConstant(1u, "layout(constant_id = ${ID}) gl_MaxImageUnits;")),
			4,
			"    bool ok;\n",
			"",
			"    sb_out.ok = (gl_MaxImageUnits >= 8);\n",	// implementation defined, 8 is the minimum
			makeVector(OffsetValue(4,  0, makeValueBool32(true))),
			(FeatureFlags)0,
		},
		{
			"specialized",
			makeVector(SpecConstant(1u, "layout(constant_id = ${ID}) gl_MaxImageUnits;", 4, makeValueInt32(12))),
			4,
			"    int maxImageUnits;\n",
			"",
			"    sb_out.maxImageUnits = gl_MaxImageUnits;\n",
			makeVector(OffsetValue(4,  0, makeValueInt32(12))),
			(FeatureFlags)0,
		},
	};

	for (int defNdx = 0; defNdx < DE_LENGTH_OF_ARRAY(defs); ++defNdx)
		testGroup->addChild(new SpecConstantTest(testCtx, shaderStage, defs[defNdx]));

	return testGroup.release();
}